

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

int generate_key_from_aid(char *account_id,uint8_t *key)

{
  long lVar1;
  undefined2 local_2f;
  undefined1 local_2d;
  uint8_t local_2c [5];
  char byte [3];
  uint8_t aid [8];
  int i;
  uint8_t *key_local;
  char *account_id_local;
  
  aid[0] = '\0';
  aid[1] = '\0';
  aid[2] = '\0';
  aid[3] = '\0';
  while( true ) {
    if (7 < (int)aid._0_4_) {
      if (account_id[(int)(aid._0_4_ << 1)] == '\0') {
        cma_keygen(local_2c,key);
        account_id_local._4_4_ = 0;
      }
      else {
        account_id_local._4_4_ = -1;
      }
      return account_id_local._4_4_;
    }
    local_2f = *(undefined2 *)(account_id + (int)(aid._0_4_ << 1));
    local_2d = 0;
    lVar1 = strtol((char *)&local_2f,(char **)0x0,0x10);
    local_2c[(int)aid._0_4_] = (uint8_t)lVar1;
    if ((local_2c[(int)aid._0_4_] == '\0') && (((char)local_2f != '0' || (local_2f._1_1_ != '0'))))
    break;
    aid._0_4_ = aid._0_4_ + 1;
  }
  return -1;
}

Assistant:

int generate_key_from_aid(const char *account_id, uint8_t key[0x20]) {
  int i;
  uint8_t aid[8];
  for (i = 0; i < 0x08; i++) {
    char byte[3];
    memcpy(byte, &account_id[2*i], 2);
    byte[2] = '\0';
    aid[i] = strtol(byte, NULL, 16);
    if (aid[i] == 0 && !(byte[0] == '0' && byte[1] == '0')) {
      return -1;
    }
  }
  if (account_id[2*i] != '\0') {
    return -1;
  }
  cma_keygen(aid, key);
  return 0;
}